

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O1

int run_test_condvar_2(void)

{
  uv_mutex_t *puVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  ulong uVar9;
  code *pcVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  short *psVar13;
  char *pcVar14;
  uv_connect_t *puVar15;
  uv_tcp_t *puVar16;
  bool bVar17;
  uv_thread_t thread;
  worker_config_conflict wc;
  undefined1 auStack_690 [16];
  undefined1 auStack_680 [16];
  code *pcStack_670;
  code *pcStack_668;
  code *pcStack_660;
  code *pcStack_658;
  undefined1 auStack_644 [16];
  undefined1 auStack_634 [28];
  int aiStack_618 [24];
  long alStack_5b8 [31];
  undefined1 auStack_4c0 [96];
  undefined1 auStack_460 [248];
  long lStack_368;
  ulong uStack_360;
  worker_config_conflict wStack_358;
  worker_config_conflict *pwStack_2a0;
  undefined1 *puStack_298;
  int *piStack_290;
  undefined1 auStack_280 [8];
  worker_config_conflict wStack_278;
  code *pcStack_1c0;
  worker_config_conflict *pwStack_1b0;
  undefined1 auStack_190 [8];
  worker_config_conflict wStack_188;
  worker_config_conflict *pwStack_d0;
  undefined1 auStack_c8 [8];
  worker_config_conflict local_c0;
  
  pwStack_d0 = (worker_config_conflict *)0x155baf;
  worker_config_init(&local_c0,1,condvar_signal,condvar_wait);
  pwStack_d0 = (worker_config_conflict *)0x155bc1;
  iVar3 = uv_thread_create(auStack_c8,worker,&local_c0);
  if (iVar3 == 0) {
    pwStack_d0 = (worker_config_conflict *)0x155bd5;
    iVar3 = (*local_c0.wait_cond)(&local_c0,&local_c0.posted_1);
    if (iVar3 != 0) goto LAB_00155c0f;
    pwStack_d0 = (worker_config_conflict *)0x155be9;
    (*local_c0.signal_cond)(&local_c0,&local_c0.posted_2);
    pwStack_d0 = (worker_config_conflict *)0x155bf1;
    iVar3 = uv_thread_join(auStack_c8);
    if (iVar3 == 0) {
      pwStack_d0 = (worker_config_conflict *)0x155bff;
      worker_config_destroy(&local_c0);
      return 0;
    }
  }
  else {
    pwStack_d0 = (worker_config_conflict *)0x155c0f;
    run_test_condvar_2_cold_1();
LAB_00155c0f:
    pwStack_d0 = (worker_config_conflict *)0x155c14;
    run_test_condvar_2_cold_2();
  }
  pwStack_d0 = (worker_config_conflict *)run_test_condvar_3;
  run_test_condvar_2_cold_3();
  puVar11 = auStack_190;
  puVar12 = auStack_190;
  pwStack_d0 = &local_c0;
  worker_config_init(&wStack_188,0,condvar_signal,condvar_timedwait);
  pcVar10 = worker;
  iVar3 = uv_thread_create(auStack_190,worker,&wStack_188);
  if (iVar3 == 0) {
    (*wStack_188.wait_cond)(&wStack_188,&wStack_188.posted_1);
    pcVar10 = (code *)&wStack_188.posted_2;
    (*wStack_188.signal_cond)(&wStack_188,(int *)pcVar10);
    iVar3 = uv_thread_join();
    puVar11 = puVar12;
    if (iVar3 == 0) {
      worker_config_destroy(&wStack_188);
      return 0;
    }
  }
  else {
    run_test_condvar_3_cold_1();
  }
  run_test_condvar_3_cold_2();
  puVar12 = puVar11 + 0x40;
  pcStack_1c0 = (code *)0x155cba;
  pwStack_1b0 = &wStack_188;
  uv_mutex_lock(puVar12);
  pcStack_1c0 = (code *)0x155cc2;
  uv_sem_post(puVar11);
  do {
    pcStack_1c0 = (code *)0x155cd6;
    iVar3 = uv_cond_timedwait(puVar11 + 0x68,puVar12,1000000000);
    if (iVar3 != 0) {
      pcStack_1c0 = (code *)0x155d0d;
      condvar_timedwait_cold_1();
      goto LAB_00155d0d;
    }
  } while (*(int *)pcVar10 == 0);
  if (*(int *)pcVar10 == 1) {
    pcStack_1c0 = (code *)0x155cee;
    uv_mutex_unlock(puVar12);
    pcStack_1c0 = (code *)0x155cfa;
    uv_sem_wait(puVar11 + 0x20);
    return 0;
  }
LAB_00155d0d:
  pcStack_1c0 = run_test_condvar_4;
  condvar_timedwait_cold_2();
  pcStack_1c0 = (code *)puVar11;
  worker_config_init(&wStack_278,1,condvar_signal,condvar_timedwait);
  iVar3 = uv_thread_create(auStack_280,worker,&wStack_278);
  if (iVar3 == 0) {
    (*wStack_278.wait_cond)(&wStack_278,&wStack_278.posted_1);
    (*wStack_278.signal_cond)(&wStack_278,&wStack_278.posted_2);
    iVar3 = uv_thread_join(auStack_280);
    if (iVar3 == 0) {
      worker_config_destroy(&wStack_278);
      return 0;
    }
  }
  else {
    run_test_condvar_4_cold_1();
  }
  run_test_condvar_4_cold_2();
  uStack_360 = 0x155db7;
  pwStack_2a0 = &wStack_278;
  puStack_298 = puVar12;
  piStack_290 = (int *)pcVar10;
  worker_config_init(&wStack_358,0,(signal_func)0x0,(wait_func)0x0);
  puVar1 = &wStack_358.mutex;
  uStack_360 = 0x155dc4;
  uv_mutex_lock(puVar1);
  uStack_360 = 0x155dc9;
  lVar6 = uv_hrtime();
  uStack_360 = 0x155dde;
  uVar4 = uv_cond_timedwait(&wStack_358.cond,puVar1,100000000);
  uStack_360 = 0x155de5;
  lVar7 = uv_hrtime();
  uStack_360 = 0x155df0;
  uv_mutex_unlock(puVar1);
  if (uVar4 == 0xffffff92) {
    if ((ulong)(lVar7 - lVar6) < 75000000) goto LAB_00155e27;
    if ((ulong)(lVar7 - lVar6) < 0x1dcd6501) {
      uStack_360 = 0x155e12;
      worker_config_destroy(&wStack_358);
      return 0;
    }
  }
  else {
    uStack_360 = 0x155e27;
    run_test_condvar_5_cold_1();
LAB_00155e27:
    uStack_360 = 0x155e2c;
    run_test_condvar_5_cold_2();
  }
  uStack_360 = 0x155e31;
  run_test_condvar_5_cold_3();
  pcStack_658 = (code *)0x155e42;
  lStack_368 = lVar6;
  uStack_360 = (ulong)uVar4;
  uVar8 = uv_default_loop();
  iVar3 = (int)auStack_460;
  pcStack_658 = (code *)0x155e55;
  iVar5 = uv_tcp_init(uVar8);
  if (iVar5 == 0) {
    iVar3 = 0x23a3;
    pcStack_658 = (code *)0x155e73;
    iVar5 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_644);
    if (iVar5 != 0) goto LAB_00155f8b;
    puVar11 = auStack_460;
    pcStack_658 = (code *)0x155e9c;
    iVar5 = uv_tcp_connect(auStack_4c0,puVar11,auStack_644,connect_4);
    iVar3 = (int)puVar11;
    if (iVar5 != 0) goto LAB_00155f90;
    pcStack_658 = (code *)0x155eb6;
    iVar3 = uv_interface_addresses(alStack_5b8);
    if (iVar3 != 0) {
LAB_00155eba:
      iVar3 = 0;
      pcStack_658 = (code *)0x155ec4;
      iVar5 = uv_run(uVar8);
      if (iVar5 == 0) {
        return 0;
      }
      goto LAB_00155f95;
    }
    if ((long)aiStack_618[0] < 1) {
LAB_00155f7c:
      pcStack_658 = (code *)0x155f81;
      uv_free_interface_addresses();
      goto LAB_00155eba;
    }
    psVar13 = (short *)(alStack_5b8[0] + 0x14);
    uVar9 = 1;
    do {
      sVar2 = *psVar13;
      if (sVar2 == 10) break;
      psVar13 = psVar13 + 0x28;
      bVar17 = uVar9 < (ulong)(long)aiStack_618[0];
      uVar9 = uVar9 + 1;
    } while (bVar17);
    pcStack_658 = (code *)0x155f1d;
    uv_free_interface_addresses(alStack_5b8[0]);
    if (sVar2 != 10) goto LAB_00155eba;
    iVar3 = (int)alStack_5b8;
    pcStack_658 = (code *)0x155f33;
    iVar5 = uv_tcp_init(uVar8);
    if (iVar5 != 0) goto LAB_00155f9a;
    iVar3 = 0x23a3;
    pcStack_658 = (code *)0x155f4d;
    iVar5 = uv_ip6_addr("::",0x23a3,auStack_634);
    if (iVar5 == 0) {
      pcStack_658 = (code *)0x155f6f;
      iVar3 = uv_tcp_connect(aiStack_618,alStack_5b8,auStack_634,connect_6);
      if (iVar3 != 0) {
        pcStack_658 = (code *)0x155f7c;
        run_test_connect_unspecified_cold_6();
        goto LAB_00155f7c;
      }
      goto LAB_00155eba;
    }
  }
  else {
    pcStack_658 = (code *)0x155f8b;
    run_test_connect_unspecified_cold_1();
LAB_00155f8b:
    pcStack_658 = (code *)0x155f90;
    run_test_connect_unspecified_cold_2();
LAB_00155f90:
    pcStack_658 = (code *)0x155f95;
    run_test_connect_unspecified_cold_3();
LAB_00155f95:
    pcStack_658 = (code *)0x155f9a;
    run_test_connect_unspecified_cold_7();
LAB_00155f9a:
    pcStack_658 = (code *)0x155f9f;
    run_test_connect_unspecified_cold_4();
  }
  pcStack_658 = connect_4;
  run_test_connect_unspecified_cold_5();
  if (iVar3 != -99) {
    return extraout_EAX;
  }
  pcStack_660 = connect_6;
  connect_4_cold_1();
  if (iVar3 != -99) {
    return extraout_EAX_00;
  }
  pcStack_668 = run_test_connection_fail;
  connect_6_cold_1();
  pcVar10 = on_connect_with_close;
  pcStack_670 = (code *)0x155fc9;
  pcStack_668 = (code *)uVar8;
  connection_fail(on_connect_with_close);
  if (timer_close_cb_calls == 0) {
    if (timer_cb_calls != 0) goto LAB_0015601d;
    pcStack_670 = (code *)0x155fe0;
    uVar8 = uv_default_loop();
    pcStack_670 = (code *)0x155ff4;
    uv_walk(uVar8,close_walk_cb,0);
    pcStack_670 = (code *)0x155ffe;
    uv_run(uVar8);
    pcStack_670 = (code *)0x156003;
    pcVar10 = (code *)uv_default_loop();
    pcStack_670 = (code *)0x15600b;
    iVar3 = uv_loop_close();
    if (iVar3 == 0) {
      pcStack_670 = (code *)0x156014;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_670 = (code *)0x15601d;
    run_test_connection_fail_cold_1();
LAB_0015601d:
    pcStack_670 = (code *)0x156022;
    run_test_connection_fail_cold_2();
  }
  pcStack_670 = connection_fail;
  run_test_connection_fail_cold_3();
  pcVar14 = "0.0.0.0";
  iVar5 = 0;
  pcStack_670 = (code *)uVar8;
  iVar3 = uv_ip4_addr("0.0.0.0",0,auStack_680);
  if (iVar3 == 0) {
    puVar15 = (uv_connect_t *)0x1a4e5a;
    iVar5 = 0x23a3;
    iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_690);
    if (iVar3 != 0) goto LAB_001560da;
    puVar15 = (uv_connect_t *)uv_default_loop();
    iVar5 = 0x2f5030;
    iVar3 = uv_tcp_init();
    if (iVar3 != 0) goto LAB_001560df;
    puVar16 = &tcp;
    puVar11 = auStack_680;
    iVar3 = uv_tcp_bind(&tcp,puVar11,0);
    iVar5 = (int)puVar11;
    puVar15 = (uv_connect_t *)puVar16;
    if (iVar3 != 0) goto LAB_001560e4;
    puVar15 = &req;
    iVar5 = 0x2f5030;
    iVar3 = uv_tcp_connect(&req,&tcp,auStack_690,pcVar10);
    if (iVar3 != 0) goto LAB_001560e9;
    puVar15 = (uv_connect_t *)uv_default_loop();
    iVar5 = 0;
    iVar3 = uv_run();
    if (connect_cb_calls != 1) goto LAB_001560ee;
    if (close_cb_calls == 1) {
      return iVar3;
    }
  }
  else {
    connection_fail_cold_1();
    puVar15 = (uv_connect_t *)pcVar14;
LAB_001560da:
    connection_fail_cold_2();
LAB_001560df:
    connection_fail_cold_3();
LAB_001560e4:
    connection_fail_cold_4();
LAB_001560e9:
    connection_fail_cold_5();
LAB_001560ee:
    connection_fail_cold_6();
  }
  connection_fail_cold_7();
  if ((uv_tcp_t *)(((uv_tcp_t *)puVar15)->u).reserved[3] == &tcp) {
    if (iVar5 != -0x6f) goto LAB_0015612f;
    connect_cb_calls = connect_cb_calls + 1;
    if (close_cb_calls == 0) {
      iVar3 = uv_close(&tcp,on_close);
      return iVar3;
    }
  }
  else {
    on_connect_with_close_cold_1();
LAB_0015612f:
    on_connect_with_close_cold_2();
  }
  on_connect_with_close_cold_3();
  uVar8 = uv_default_loop();
  iVar5 = 0x2f4f98;
  iVar3 = uv_timer_init(uVar8);
  if (iVar3 == 0) {
    connection_fail(on_connect_without_close);
    if (timer_close_cb_calls != 1) goto LAB_001561b2;
    if (timer_cb_calls == 1) {
      uVar8 = uv_default_loop();
      uv_walk(uVar8,close_walk_cb,0);
      iVar5 = 0;
      uv_run(uVar8);
      uVar8 = uv_default_loop();
      iVar3 = uv_loop_close(uVar8);
      if (iVar3 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001561bc;
    }
  }
  else {
    run_test_connection_fail_doesnt_auto_close_cold_1();
LAB_001561b2:
    run_test_connection_fail_doesnt_auto_close_cold_2();
  }
  run_test_connection_fail_doesnt_auto_close_cold_3();
LAB_001561bc:
  run_test_connection_fail_doesnt_auto_close_cold_4();
  if (iVar5 == -0x6f) {
    connect_cb_calls = connect_cb_calls + 1;
    uv_timer_start(&timer,timer_cb,100,0);
    if (close_cb_calls == 0) {
      return extraout_EAX_01;
    }
  }
  else {
    on_connect_without_close_cold_1();
  }
  on_connect_without_close_cold_2();
  close_cb_calls = close_cb_calls + 1;
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(condvar_2) {
  worker_config wc;
  uv_thread_t thread;

  /* Helper to signal-then-wait. */
  worker_config_init(&wc, 1, condvar_signal, condvar_wait);
  ASSERT(0 == uv_thread_create(&thread, worker, &wc));

  /* We wait-then-signal. */
  ASSERT(0 == wc.wait_cond(&wc, &wc.posted_1));
  wc.signal_cond(&wc, &wc.posted_2);

  ASSERT(0 == uv_thread_join(&thread));
  worker_config_destroy(&wc);

  return 0;
}